

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O1

int tcp_listener_get_keepalive(void *arg,void *buf,size_t *szp,nni_type t)

{
  _Bool b;
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  b = *(_Bool *)((long)arg + 299);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  iVar1 = nni_copyout_bool(b,buf,szp,t);
  return iVar1;
}

Assistant:

static int
tcp_listener_get_keepalive(void *arg, void *buf, size_t *szp, nni_type t)
{
	bool          b;
	tcp_listener *l = arg;
	nni_mtx_lock(&l->mtx);
	b = l->keepalive;
	nni_mtx_unlock(&l->mtx);
	return (nni_copyout_bool(b, buf, szp, t));
}